

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDFace::SharpEdgeCount(ON_SubDFace *this)

{
  unsigned_short uVar1;
  ON_SubDEdgePtr *pOVar2;
  bool bVar3;
  uint uVar4;
  ON_SubDEdge *this_00;
  unsigned_short fei;
  unsigned_short uVar5;
  ON_SubDEdgePtr *pOVar6;
  
  pOVar6 = this->m_edge4;
  uVar1 = this->m_edge_count;
  pOVar2 = this->m_edgex;
  uVar5 = 0;
  uVar4 = 0;
  while( true ) {
    if (uVar1 == uVar5) {
      return uVar4;
    }
    if (uVar5 == 4) {
      pOVar6 = pOVar2;
    }
    if (uVar5 == 4 && pOVar2 == (ON_SubDEdgePtr *)0x0) break;
    this_00 = (ON_SubDEdge *)(pOVar6->m_ptr & 0xfffffffffffffff8);
    if (this_00 != (ON_SubDEdge *)0x0) {
      bVar3 = ON_SubDEdge::IsSharp(this_00);
      uVar4 = uVar4 + bVar3;
    }
    uVar5 = uVar5 + 1;
    pOVar6 = pOVar6 + 1;
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDFace::SharpEdgeCount() const
{
  unsigned int sharp_edge_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr != e && e->IsSharp())
      ++sharp_edge_count;
  }
  return sharp_edge_count;
}